

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O3

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,DSPOMDP *model)

{
  pointer *pppSVar1;
  pointer ppSVar2;
  iterator __position;
  pointer ppSVar3;
  int iVar4;
  undefined4 extraout_var;
  log_ostream *plVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  State *pSVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double max;
  double dVar14;
  State *particle;
  State *local_38;
  
  max = 1.0 / (double)num;
  dVar13 = Random::NextDouble((Random *)&Random::RANDOM,0.0,max);
  dVar14 = (*(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
             _M_impl.super__Vector_impl_data._M_start)->weight;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < num) {
    iVar10 = 0;
    iVar8 = 0;
    do {
      ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (dVar13 <= dVar14) {
        pSVar9 = ppSVar2[iVar10];
      }
      else {
        do {
          iVar10 = iVar10 + 1;
          if ((long)(particles->
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3 == (long)iVar10) {
            iVar10 = 0;
          }
          pSVar9 = ppSVar2[iVar10];
          dVar14 = dVar14 + pSVar9->weight;
        } while (dVar14 < dVar13);
      }
      iVar4 = (*model->_vptr_DSPOMDP[0x16])(model,pSVar9);
      local_38 = (State *)CONCAT44(extraout_var,iVar4);
      local_38->weight = max;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<despot::State*,std::allocator<despot::State*>>::
        _M_realloc_insert<despot::State*const&>
                  ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppSVar1 = &(__return_storage_ptr__->
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
      dVar13 = dVar13 + max;
      iVar8 = iVar8 + 1;
    } while (iVar8 != num);
    ppSVar2 = (__return_storage_ptr__->
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar3 = (__return_storage_ptr__->
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ppSVar2 != ppSVar3) && (ppSVar2 + 1 != ppSVar3)) {
      lVar11 = 8;
      do {
        iVar8 = rand();
        lVar7 = (long)iVar8 % ((lVar11 >> 3) + 1);
        if (lVar11 != lVar7 * 8) {
          pSVar9 = *(State **)((long)ppSVar2 + lVar11);
          *(State **)((long)ppSVar2 + lVar11) = ppSVar2[lVar7];
          ppSVar2[lVar7] = pSVar9;
        }
        lVar7 = lVar11 + 8;
        lVar11 = lVar11 + 8;
      } while ((pointer)((long)ppSVar2 + lVar7) != ppSVar3);
    }
  }
  iVar8 = logging::level();
  if ((0 < iVar8) && (iVar8 = logging::level(), 3 < iVar8)) {
    plVar5 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar5->super_ostream,"[ParticleBelief::Sample] Sampled ",0x21);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)plVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," particles",10);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if ((__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      iVar8 = logging::level();
      if ((0 < iVar8) && (iVar8 = logging::level(), 4 < iVar8)) {
        plVar5 = logging::stream(5);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar5->super_ostream," ",1);
        poVar6 = (ostream *)std::ostream::operator<<(plVar5,(int)uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        poVar6 = despot::operator<<(poVar6,(__return_storage_ptr__->
                                           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar12]);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Sample(int num, vector<State*> particles,
	const DSPOMDP* model) {

	double unit = 1.0 / num;
	double mass = Random::RANDOM.NextDouble(0, unit);
	int pos = 0;
	double cur = particles[0]->weight;
	vector<State*> sample;
	for (int i = 0; i < num; i++) {
		while (mass > cur) {
			pos++;
			if (pos == particles.size())
				pos = 0;

			cur += particles[pos]->weight;
		}

		mass += unit;

		State* particle = model->Copy(particles[pos]);
		particle->weight = unit;
		sample.push_back(particle);
	}

	random_shuffle(sample.begin(), sample.end());

	logd << "[ParticleBelief::Sample] Sampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}